

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

void __thiscall File::~File(File *this)

{
  if (-1 < this->fd) {
    flock(this->fd,8);
  }
  if ((FILE *)this->file != (FILE *)0x0) {
    fclose((FILE *)this->file);
    return;
  }
  return;
}

Assistant:

~File() {
        if (fd >= 0) {
#    ifdef _WIN32
            if (hFile != INVALID_HANDLE_VALUE) {
                OVERLAPPED overlapped = {};
                UnlockFileEx(hFile, 0, MAXDWORD, MAXDWORD, &overlapped);
            }
#    else
            flock(fd, LOCK_UN);
#    endif
        }

        if (file) {
            fclose(file);
        }
    }